

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MppBufferImpl * mpp_buffer_get_unused(MppBufferGroupImpl *p,size_t size,char *caller)

{
  list_head *plVar1;
  bool bVar2;
  int iVar3;
  int local_40;
  RK_S32 search_count;
  RK_S32 found;
  MppBufferImpl *n;
  MppBufferImpl *pos;
  MppBufferImpl *buffer;
  char *caller_local;
  size_t size_local;
  MppBufferGroupImpl *p_local;
  
  if ((mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_get_unused");
  }
  pos = (MppBufferImpl *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)&p->buf_lock);
  iVar3 = list_empty(&p->list_unused);
  if (iVar3 == 0) {
    bVar2 = false;
    local_40 = 0;
    plVar1 = (p->list_unused).next;
    n = (MppBufferImpl *)&plVar1[-0xd].prev;
    plVar1 = plVar1->next;
    while (_search_count = &plVar1[-0xd].prev, &n->list_status != &p->list_unused) {
      if ((mpp_buffer_debug & 0x100) != 0) {
        _mpp_log_l(4,"mpp_buffer","request size %d on buf idx %d size %d\n",(char *)0x0,size,
                   (ulong)(uint)n->buffer_id,(n->info).size);
      }
      if (size <= (n->info).size) {
        pos = n;
        pthread_mutex_lock((pthread_mutex_t *)&n->lock);
        n->ref_count = n->ref_count + 1;
        n->used = 1;
        buf_add_log(n,BUF_REF_INC,caller);
        list_del_init(&n->list_status);
        list_add_tail(&n->list_status,&p->list_used);
        p->count_used = p->count_used + 1;
        p->count_unused = p->count_unused + -1;
        pthread_mutex_unlock((pthread_mutex_t *)&n->lock);
        bVar2 = true;
        break;
      }
      if (p->mode == MPP_BUFFER_INTERNAL) {
        put_buffer(p,n,0,caller);
      }
      else {
        local_40 = local_40 + 1;
      }
      n = (MppBufferImpl *)_search_count;
      plVar1 = plVar1->next;
    }
    if ((!bVar2) && (local_40 != 0)) {
      _mpp_log_l(2,"mpp_buffer","can not found match buffer with size larger than %d\n",
                 "mpp_buffer_get_unused",size);
      mpp_buffer_group_dump(p,caller);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&p->buf_lock);
  if ((mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_get_unused");
  }
  return pos;
}

Assistant:

MppBufferImpl *mpp_buffer_get_unused(MppBufferGroupImpl *p, size_t size, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MppBufferImpl *buffer = NULL;

    pthread_mutex_lock(&p->buf_lock);
    if (!list_empty(&p->list_unused)) {
        MppBufferImpl *pos, *n;
        RK_S32 found = 0;
        RK_S32 search_count = 0;

        list_for_each_entry_safe(pos, n, &p->list_unused, MppBufferImpl, list_status) {
            mpp_buf_dbg(MPP_BUF_DBG_CHECK_SIZE, "request size %d on buf idx %d size %d\n",
                        size, pos->buffer_id, pos->info.size);
            if (pos->info.size >= size) {
                buffer = pos;
                pthread_mutex_lock(&buffer->lock);
                buffer->ref_count++;
                buffer->used = 1;
                buf_add_log(buffer, BUF_REF_INC, caller);
                list_del_init(&buffer->list_status);
                list_add_tail(&buffer->list_status, &p->list_used);
                p->count_used++;
                p->count_unused--;
                pthread_mutex_unlock(&buffer->lock);
                found = 1;
                break;
            } else {
                if (MPP_BUFFER_INTERNAL == p->mode) {
                    put_buffer(p, pos, 0, caller);
                } else
                    search_count++;
            }
        }

        if (!found && search_count) {
            mpp_err_f("can not found match buffer with size larger than %d\n", size);
            mpp_buffer_group_dump(p, caller);
        }
    }
    pthread_mutex_unlock(&p->buf_lock);

    MPP_BUF_FUNCTION_LEAVE();
    return buffer;
}